

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

size_t al_utf16_width(int c)

{
  size_t sVar1;
  
  sVar1 = 2;
  if (0xffff < (uint)c) {
    sVar1 = (ulong)((uint)c < 0x110000) << 2;
  }
  return sVar1;
}

Assistant:

size_t al_utf16_width(int c)
{
   /* So we don't need to check for negative values nor use unsigned ints
    * in the interface, which are a pain.
    */
   uint32_t uc = c;

   /* We do not check for invalid code points. */
   if (uc <= 0xffff)
      return 2;
   if (uc <= 0x10ffff)
      return 4;

   /* The rest are illegal. */
   return 0;
}